

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O3

double icu_63::double_conversion::RadixStringToIeee<4,unsigned_short_const*>
                 (unsigned_short **current,unsigned_short *end,bool sign,bool allow_trailing_junk,
                 double junk_string_value,bool read_as_double,bool *result_is_junk)

{
  ushort uVar1;
  sbyte sVar2;
  double dVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ushort *puVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  DiyFp diy_fp;
  
  *result_is_junk = true;
  puVar7 = *current;
  while (*puVar7 == 0x30) {
    puVar7 = puVar7 + 1;
    *current = puVar7;
    if (puVar7 == end) {
      *result_is_junk = false;
      if (sign) {
        return -0.0;
      }
      return 0.0;
    }
  }
  sVar2 = 0x18;
  if (read_as_double) {
    sVar2 = 0x35;
  }
  lVar10 = 0;
  do {
    uVar1 = *puVar7;
    uVar11 = uVar1 - 0x30;
    if (9 < uVar11) {
      if ((ushort)(uVar1 - 0x61) < 6) {
        uVar11 = uVar1 - 0x57;
      }
      else {
        if (5 < (ushort)(uVar1 - 0x41)) {
          if (puVar7 != end && !allow_trailing_junk) {
            do {
              uVar1 = *puVar7;
              lVar13 = 0;
              if (uVar1 < 0x80) {
                while ((int)(char)(&kWhitespaceTable7)[lVar13] != (uint)uVar1) {
                  lVar13 = lVar13 + 1;
                  if (lVar13 == 6) {
                    return junk_string_value;
                  }
                }
              }
              else {
                while (*(ushort *)((long)&kWhitespaceTable16 + lVar13) != uVar1) {
                  lVar13 = lVar13 + 2;
                  if (lVar13 == 0x28) {
                    return junk_string_value;
                  }
                }
              }
              puVar7 = puVar7 + 1;
              *current = puVar7;
            } while (puVar7 != end);
          }
          break;
        }
        uVar11 = uVar1 - 0x37;
      }
    }
    lVar10 = (ulong)uVar11 + lVar10 * 0x10;
    uVar12 = lVar10 >> sVar2;
    if ((int)uVar12 != 0) {
      iVar5 = 1;
      if (1 < (int)uVar12) {
        uVar6 = uVar12 & 0xffffffff;
        do {
          iVar5 = iVar5 + 1;
          uVar6 = uVar6 >> 1;
          uVar11 = (uint)uVar12;
          uVar12 = uVar6;
        } while (3 < uVar11);
      }
      bVar4 = (byte)iVar5;
      uVar12 = lVar10 >> (bVar4 & 0x3f);
      puVar7 = puVar7 + 1;
      if (puVar7 == end) {
        bVar8 = 1;
      }
      else {
        bVar8 = 1;
        do {
          uVar1 = *puVar7;
          if ((0x3f < uVar1 || 9 < uVar1 - 0x30) &&
             ((0x25 < uVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar1 - 0x41) & 0x3f) & 1) == 0)))
             ) {
            *current = puVar7;
            if (!allow_trailing_junk) {
              do {
                uVar1 = *puVar7;
                lVar13 = 0;
                if (uVar1 < 0x80) {
                  while ((int)(char)(&kWhitespaceTable7)[lVar13] != (uint)uVar1) {
                    lVar13 = lVar13 + 1;
                    if (lVar13 == 6) {
                      return junk_string_value;
                    }
                  }
                }
                else {
                  while (*(ushort *)((long)&kWhitespaceTable16 + lVar13) != uVar1) {
                    lVar13 = lVar13 + 2;
                    if (lVar13 == 0x28) {
                      return junk_string_value;
                    }
                  }
                }
                puVar7 = puVar7 + 1;
                *current = puVar7;
              } while (puVar7 != end);
            }
            goto LAB_00250229;
          }
          bVar8 = bVar8 & uVar1 == 0x30;
          iVar5 = iVar5 + 4;
          puVar7 = puVar7 + 1;
        } while (puVar7 != end);
      }
      *current = puVar7;
LAB_00250229:
      uVar9 = (uint)lVar10 & ~(-1 << (bVar4 & 0x1f));
      uVar11 = 1 << (bVar4 - 1 & 0x1f);
      if ((int)uVar11 < (int)uVar9) {
        uVar12 = uVar12 + 1;
      }
      else if (uVar9 == uVar11) {
        uVar12 = uVar12 + ((byte)(~bVar8 | (byte)uVar12) & 1);
      }
      bVar14 = (uVar12 >> sVar2 & 1) != 0;
      diy_fp._8_8_ = (Double *)((long)uVar12 >> bVar14);
      *result_is_junk = false;
      diy_fp.f_ = (ulong)(iVar5 + (uint)bVar14);
      dVar3 = (double)Double::DiyFpToUint64(diy_fp._8_8_,diy_fp);
      return dVar3;
    }
    puVar7 = puVar7 + 1;
    *current = puVar7;
  } while (puVar7 != end);
  *result_is_junk = false;
  if (sign) {
    if (lVar10 == 0) {
      return -0.0;
    }
    lVar10 = -lVar10;
  }
  return (double)lVar10;
}

Assistant:

static double RadixStringToIeee(Iterator* current,
                                Iterator end,
                                bool sign,
                                bool allow_trailing_junk,
                                double junk_string_value,
                                bool read_as_double,
                                bool* result_is_junk) {
  ASSERT(*current != end);

  const int kDoubleSize = Double::kSignificandSize;
  const int kSingleSize = Single::kSignificandSize;
  const int kSignificandSize = read_as_double? kDoubleSize: kSingleSize;

  *result_is_junk = true;

  // Skip leading 0s.
  while (**current == '0') {
    ++(*current);
    if (*current == end) {
      *result_is_junk = false;
      return SignedZero(sign);
    }
  }

  int64_t number = 0;
  int exponent = 0;
  const int radix = (1 << radix_log_2);

  do {
    int digit;
    if (IsDecimalDigitForRadix(**current, radix)) {
      digit = static_cast<char>(**current) - '0';
    } else if (IsCharacterDigitForRadix(**current, radix, 'a')) {
      digit = static_cast<char>(**current) - 'a' + 10;
    } else if (IsCharacterDigitForRadix(**current, radix, 'A')) {
      digit = static_cast<char>(**current) - 'A' + 10;
    } else {
      if (allow_trailing_junk || !AdvanceToNonspace(current, end)) {
        break;
      } else {
        return junk_string_value;
      }
    }

    number = number * radix + digit;
    int overflow = static_cast<int>(number >> kSignificandSize);
    if (overflow != 0) {
      // Overflow occurred. Need to determine which direction to round the
      // result.
      int overflow_bits_count = 1;
      while (overflow > 1) {
        overflow_bits_count++;
        overflow >>= 1;
      }

      int dropped_bits_mask = ((1 << overflow_bits_count) - 1);
      int dropped_bits = static_cast<int>(number) & dropped_bits_mask;
      number >>= overflow_bits_count;
      exponent = overflow_bits_count;

      bool zero_tail = true;
      for (;;) {
        ++(*current);
        if (*current == end || !isDigit(**current, radix)) break;
        zero_tail = zero_tail && **current == '0';
        exponent += radix_log_2;
      }

      if (!allow_trailing_junk && AdvanceToNonspace(current, end)) {
        return junk_string_value;
      }

      int middle_value = (1 << (overflow_bits_count - 1));
      if (dropped_bits > middle_value) {
        number++;  // Rounding up.
      } else if (dropped_bits == middle_value) {
        // Rounding to even to consistency with decimals: half-way case rounds
        // up if significant part is odd and down otherwise.
        if ((number & 1) != 0 || !zero_tail) {
          number++;  // Rounding up.
        }
      }

      // Rounding up may cause overflow.
      if ((number & ((int64_t)1 << kSignificandSize)) != 0) {
        exponent++;
        number >>= 1;
      }
      break;
    }
    ++(*current);
  } while (*current != end);

  ASSERT(number < ((int64_t)1 << kSignificandSize));
  ASSERT(static_cast<int64_t>(static_cast<double>(number)) == number);

  *result_is_junk = false;

  if (exponent == 0) {
    if (sign) {
      if (number == 0) return -0.0;
      number = -number;
    }
    return static_cast<double>(number);
  }

  ASSERT(number != 0);
  return Double(DiyFp(number, exponent)).value();
}